

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::BranchLayerParams::SharedDtor(BranchLayerParams *this)

{
  if (this != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    if (this->ifbranch_ != (NeuralNetwork *)0x0) {
      (*(this->ifbranch_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->elsebranch_ != (NeuralNetwork *)0x0) {
      (*(this->elsebranch_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void BranchLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete ifbranch_;
  }
  if (this != internal_default_instance()) {
    delete elsebranch_;
  }
}